

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

void __thiscall Salsa20Cipher::setKey(Salsa20Cipher *this,uint8_t *key,size_t keySize)

{
  reference pvVar1;
  ulong in_RDX;
  uint8_t paddedKey [32];
  unsigned_long sz;
  size_type in_stack_ffffffffffffff28;
  array<unsigned_int,_16UL> *in_stack_ffffffffffffff30;
  array<unsigned_int,_16UL> *this_00;
  uchar *in_stack_ffffffffffffff38;
  uint *puVar2;
  uchar *in_stack_ffffffffffffff40;
  array<unsigned_int,_16UL> local_48;
  
  local_48._M_elems[10] = 4;
  local_48._M_elems[0xb] = 0;
  local_48._M_elems._48_8_ = in_RDX;
  memset(&local_48,0,0x20);
  std::copy<unsigned_char_const*,unsigned_char*>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(uchar *)in_stack_ffffffffffffff30)
  ;
  if ((ulong)local_48._M_elems._48_8_ < 0x11) {
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)"expand 16-byte k",pvVar1);
    this_00 = &local_48;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)this_00,pvVar1);
    puVar2 = local_48._M_elems + 1;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)puVar2,pvVar1);
    puVar2 = local_48._M_elems + 2;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)puVar2,pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 3),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint("nd 16-byte k",pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint("6-byte k",pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)&local_48,pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 1),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 2),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 3),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](this_00,in_stack_ffffffffffffff28);
    bytesToUint("te k",pvVar1);
  }
  else {
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)"expand 32-byte k",pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)&local_48,pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 1),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 2),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 3),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint("nd 32-byte k",pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint("2-byte k",pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 4),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 5),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 6),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint((uint8_t *)(local_48._M_elems + 7),pvVar1);
    pvVar1 = std::array<unsigned_int,_16UL>::operator[]
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bytesToUint("te k",pvVar1);
  }
  return;
}

Assistant:

void setKey(const uint8_t key[KEY_MAX_SIZE], size_t keySize)
	{
		const auto sz = sizeof(uint32_t);
		
		uint8_t paddedKey[KEY_MAX_SIZE] = { 0 };
		std::copy(key, key + keySize, paddedKey);
		
		if (keySize > KEY_MAX_SIZE / 2) {
			static const auto magic = reinterpret_cast<const uint8_t*>("expand 32-byte k");
			
			bytesToUint(magic + 0 * sz, m_state[0]);
			bytesToUint(paddedKey + 0 * sz, m_state[1]);
			bytesToUint(paddedKey + 1 * sz, m_state[2]);
			bytesToUint(paddedKey + 2 * sz, m_state[3]);
			bytesToUint(paddedKey + 3 * sz, m_state[4]);
			bytesToUint(magic + 1 * sz, m_state[5]);
			bytesToUint(magic + 2 * sz, m_state[10]);
			bytesToUint(paddedKey + 4 * sz, m_state[11]);
			bytesToUint(paddedKey + 5 * sz, m_state[12]);
			bytesToUint(paddedKey + 6 * sz, m_state[13]);
			bytesToUint(paddedKey + 7 * sz, m_state[14]);
			bytesToUint(magic + 3 * sz, m_state[15]);
		} else {
			static const auto magic = reinterpret_cast<const uint8_t*>("expand 16-byte k");
			
			bytesToUint(magic + 0 * sz, m_state[0]);
			bytesToUint(paddedKey + 0 * sz, m_state[1]);
			bytesToUint(paddedKey + 1 * sz, m_state[2]);
			bytesToUint(paddedKey + 2 * sz, m_state[3]);
			bytesToUint(paddedKey + 3 * sz, m_state[4]);
			bytesToUint(magic + 1 * sz, m_state[5]);
			bytesToUint(magic + 2 * sz, m_state[10]);
			bytesToUint(paddedKey + 0 * sz, m_state[11]);
			bytesToUint(paddedKey + 1 * sz, m_state[12]);
			bytesToUint(paddedKey + 2 * sz, m_state[13]);
			bytesToUint(paddedKey + 3 * sz, m_state[14]);
			bytesToUint(magic + 3 * sz, m_state[15]);
		}
	}